

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void mine<false>(randomx_vm *vm,atomic<unsigned_int> *atomicNonce,AtomicHash *result,
                uint32_t noncesCount,int thread,int cpuid)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  byte bVar6;
  uint8_t blockTemplate [76];
  uint64_t hash [4];
  
  bVar6 = 0;
  if (-1 < cpuid) {
    blockTemplate._0_4_ = cpuid;
    iVar1 = set_thread_affinity((uint *)blockTemplate);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to set thread affinity for thread ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,thread);
      poVar2 = std::operator<<(poVar2," (error=");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,")");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  puVar4 = blockTemplate_;
  puVar5 = blockTemplate;
  for (lVar3 = 0x4c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  while( true ) {
    LOCK();
    blockTemplate._39_4_ = (atomicNonce->super___atomic_base<unsigned_int>)._M_i;
    (atomicNonce->super___atomic_base<unsigned_int>)._M_i =
         (atomicNonce->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
    if (noncesCount <= (uint)blockTemplate._39_4_) break;
    randomx_calculate_hash(vm,blockTemplate,0x4c,hash);
    AtomicHash::xorWith(result,hash);
  }
  return;
}

Assistant:

void mine(randomx_vm* vm, std::atomic<uint32_t>& atomicNonce, AtomicHash& result, uint32_t noncesCount, int thread, int cpuid = -1) {
	if (cpuid >= 0) {
		int rc = set_thread_affinity(cpuid);
		if (rc) {
			std::cerr << "Failed to set thread affinity for thread " << thread << " (error=" << rc << ")" << std::endl;
		}
	}
	uint64_t hash[RANDOMX_HASH_SIZE / sizeof(uint64_t)];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	void* noncePtr = blockTemplate + 39;
	auto nonce = atomicNonce.fetch_add(1);

	if (batch) {
		store32(noncePtr, nonce);
		randomx_calculate_hash_first(vm, blockTemplate, sizeof(blockTemplate));
	}

	while (nonce < noncesCount) {
		if (batch) {
			nonce = atomicNonce.fetch_add(1);
		}
		store32(noncePtr, nonce);
		(batch ? randomx_calculate_hash_next : randomx_calculate_hash)(vm, blockTemplate, sizeof(blockTemplate), &hash);
		result.xorWith(hash);
		if (!batch) {
			nonce = atomicNonce.fetch_add(1);
		}
	}
}